

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestReferenceCounting::TextureViewTestReferenceCounting
          (TextureViewTestReferenceCounting *this,Context *context)

{
  _norm_vec4 local_44;
  _norm_vec4 local_40;
  _norm_vec4 local_3c;
  _norm_vec4 local_38;
  _norm_vec4 local_34;
  _norm_vec4 local_30 [5];
  _norm_vec4 local_1c;
  Context *local_18;
  Context *context_local;
  TextureViewTestReferenceCounting *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"reference_counting",
             "Makes sure that sampling from views, for which the parent texture object has already been deleted, works correctly."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureViewTestReferenceCounting_0323b7e0;
  this->m_bo_id = 0;
  this->m_parent_to_id = 0;
  this->m_po_id = 0;
  this->m_po_expected_texel_uniform_location = -1;
  this->m_po_lod_uniform_location = -1;
  this->m_vao_id = 0;
  this->m_view_to_id = 0;
  this->m_view_view_to_id = 0;
  this->m_vs_id = 0;
  this->m_texture_height = 0x40;
  this->m_texture_n_levels = 7;
  this->m_texture_width = 0x40;
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::vector(&this->m_mipmap_colors);
  _norm_vec4::_norm_vec4(&local_1c,'{','\"','8','N');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_1c);
  _norm_vec4::_norm_vec4(local_30,0xea,'-','C','Y');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,local_30);
  _norm_vec4::_norm_vec4(&local_34,'\"','8','N','Z');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_34);
  _norm_vec4::_norm_vec4(&local_38,'-','C','Y','\x01');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_38);
  _norm_vec4::_norm_vec4(&local_3c,'8','N','Z','{');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_3c);
  _norm_vec4::_norm_vec4(&local_40,'C','Y','\x01',0xea);
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_40);
  _norm_vec4::_norm_vec4(&local_44,'N','Z','\f','\"');
  std::
  vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
  ::push_back(&this->m_mipmap_colors,&local_44);
  return;
}

Assistant:

TextureViewTestReferenceCounting::TextureViewTestReferenceCounting(deqp::Context& context)
	: TestCase(context, "reference_counting",
			   "Makes sure that sampling from views, for which the parent texture object "
			   "has already been deleted, works correctly.")
	, m_bo_id(0)
	, m_parent_to_id(0)
	, m_po_id(0)
	, m_po_expected_texel_uniform_location(-1)
	, m_po_lod_uniform_location(-1)
	, m_vao_id(0)
	, m_view_to_id(0)
	, m_view_view_to_id(0)
	, m_vs_id(0)
	, m_texture_height(64)
	, m_texture_n_levels(7)
	, m_texture_width(64)
{
	/* Configure a vector storing unique colors that should be used
	 * for filling subsequent mip-maps of parent texture */
	m_mipmap_colors.push_back(_norm_vec4(123, 34, 56, 78));
	m_mipmap_colors.push_back(_norm_vec4(234, 45, 67, 89));
	m_mipmap_colors.push_back(_norm_vec4(34, 56, 78, 90));
	m_mipmap_colors.push_back(_norm_vec4(45, 67, 89, 1));
	m_mipmap_colors.push_back(_norm_vec4(56, 78, 90, 123));
	m_mipmap_colors.push_back(_norm_vec4(67, 89, 1, 234));
	m_mipmap_colors.push_back(_norm_vec4(78, 90, 12, 34));

	DE_ASSERT(m_mipmap_colors.size() == m_texture_n_levels);
}